

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

CharPtr __thiscall
fmt::BasicWriter<char>::write_str<char>(BasicWriter<char> *this,char *s,size_t size,AlignSpec *spec)

{
  byte bVar1;
  Buffer<char> *pBVar2;
  size_t sVar3;
  char __tmp;
  size_t __len_2;
  ulong uVar4;
  size_t __len;
  size_t __n;
  size_t __len_1;
  ulong uVar5;
  ulong __n_00;
  size_t size_1;
  CharPtr __s;
  
  uVar5 = (ulong)(spec->super_WidthSpec).width_;
  pBVar2 = this->buffer_;
  sVar3 = pBVar2->size_;
  if (uVar5 <= size) {
    uVar5 = sVar3 + size;
    if (pBVar2->capacity_ < uVar5) {
      (**pBVar2->_vptr_Buffer)(pBVar2,uVar5);
    }
    pBVar2->size_ = uVar5;
    __s = this->buffer_->ptr_ + sVar3;
    goto LAB_00125401;
  }
  uVar5 = uVar5 + sVar3;
  if (pBVar2->capacity_ < uVar5) {
    (**pBVar2->_vptr_Buffer)(pBVar2,uVar5);
  }
  pBVar2->size_ = uVar5;
  __s = this->buffer_->ptr_ + sVar3;
  bVar1 = (byte)(spec->super_WidthSpec).fill_;
  uVar5 = (ulong)(spec->super_WidthSpec).width_;
  if (spec->align_ == ALIGN_CENTER) {
    uVar4 = uVar5 - size;
    __n_00 = uVar4 >> 1;
    if (1 < uVar4) {
      memset(__s,(uint)bVar1,__n_00);
    }
    __s = __s + __n_00;
    if (uVar5 == size) goto LAB_00125401;
    __n = uVar4 - __n_00;
  }
  else {
    if (spec->align_ == ALIGN_RIGHT) {
      if (uVar5 - size != 0) {
        memset(__s,(uint)bVar1,uVar5 - size);
      }
      __s = __s + ((spec->super_WidthSpec).width_ - size);
      goto LAB_00125401;
    }
    __n = uVar5 - size;
    if (__n == 0) goto LAB_00125401;
  }
  memset(__s + size,(uint)bVar1,__n);
LAB_00125401:
  if (size != 0) {
    memmove(__s,s,size);
  }
  return __s;
}

Assistant:

typename BasicWriter<Char>::CharPtr BasicWriter<Char>::write_str(
      const StrChar *s, std::size_t size, const AlignSpec &spec) {
  CharPtr out = CharPtr();
  if (spec.width() > size) {
    out = grow_buffer(spec.width());
    Char fill = internal::CharTraits<Char>::cast(spec.fill());
    if (spec.align() == ALIGN_RIGHT) {
      std::uninitialized_fill_n(out, spec.width() - size, fill);
      out += spec.width() - size;
    } else if (spec.align() == ALIGN_CENTER) {
      out = fill_padding(out, spec.width(), size, fill);
    } else {
      std::uninitialized_fill_n(out + size, spec.width() - size, fill);
    }
  } else {
    out = grow_buffer(size);
  }
  std::uninitialized_copy(s, s + size, out);
  return out;
}